

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O2

int Bmc_BmciPerform(Gia_Man_t *p,Vec_Int_t *vInit0,Vec_Int_t *vInit1,int nFrames,int nWords,
                   int nTimeOut,int fVerbose)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iLit1;
  uint uVar4;
  long lVar5;
  abctime aVar6;
  Gia_Man_t *p_00;
  char *pcVar7;
  Vec_Int_t *vFFLits;
  ulong uVar8;
  Gia_Man_t *pGVar9;
  Aig_Man_t *pAig;
  Cnf_Dat_t *p_01;
  Gia_Obj_t *pGVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar15;
  sat_solver *psVar16;
  int iLit;
  Vec_Int_t *local_c0;
  sat_solver *local_b8;
  Gia_Man_t *local_b0;
  Vec_Int_t *local_a8;
  int local_9c;
  ulong local_98;
  Vec_Int_t *local_90;
  Vec_Int_t *local_88;
  uint local_80;
  uint local_7c;
  uint local_78;
  int local_74;
  Gia_Man_t *local_70;
  ulong local_68;
  int local_5c;
  Vec_Int_t *local_58;
  ulong local_50;
  Gia_Man_t *pNew;
  abctime local_40;
  Cnf_Dat_t *local_38;
  
  local_9c = nFrames;
  local_80 = nTimeOut;
  local_70 = p;
  if (vInit0->nSize != p->nRegs) {
    __assert_fail("Vec_IntSize(vInit0) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                  ,0xba,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  if (vInit1->nSize != vInit0->nSize) {
    __assert_fail("Vec_IntSize(vInit1) == Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                  ,0xbb,
                  "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)");
  }
  local_b8 = sat_solver_new();
  iVar11 = 0;
  if (local_80 == 0) {
    aVar6 = 0;
  }
  else {
    lVar5 = (long)(int)local_80;
    aVar6 = Abc_Clock();
    aVar6 = aVar6 + lVar5 * 1000000;
  }
  psVar16 = local_b8;
  local_b8->nRuntimeLimit = aVar6;
  p_00 = Gia_ManStart(10000);
  pGVar9 = local_70;
  pNew = p_00;
  pcVar7 = Abc_UtilStrsav(local_70->pName);
  p_00->pName = pcVar7;
  local_b0 = p_00;
  Gia_ManHashAlloc(p_00);
  pGVar9->pObjs->Value = 0;
  vFFLits = Vec_IntAlloc(pGVar9->nRegs);
  for (; iVar11 < vInit0->nSize; iVar11 = iVar11 + 1) {
    iVar2 = Vec_IntEntry(vInit0,iVar11);
    iLit = iVar2;
    if (1 < iVar2) {
      iVar2 = Gia_ManAppendCi(local_b0);
    }
    Vec_IntPush(vFFLits,iVar2);
  }
  local_88 = Vec_IntAlloc(local_70->nRegs);
  for (iVar11 = 0; iVar11 < vInit1->nSize; iVar11 = iVar11 + 1) {
    iVar2 = Vec_IntEntry(vInit1,iVar11);
    iLit = iVar2;
    if (1 < iVar2) {
      iVar2 = Gia_ManAppendCi(local_b0);
    }
    Vec_IntPush(local_88,iVar2);
  }
  local_c0 = Vec_IntAlloc(1000);
  local_a8 = Vec_IntAlloc(1000);
  local_90 = Vec_IntAlloc(1000);
  local_58 = Vec_IntAlloc(1000);
  if (local_9c < 1) {
    local_9c = 0;
  }
  uVar13 = 0;
  local_98 = 1;
  pVVar15 = local_88;
  while (iVar11 = 1, (int)uVar13 != local_9c) {
    local_50 = uVar13;
    local_40 = Abc_Clock();
    pGVar9 = local_70;
    Bmc_BmciUnfold(local_b0,local_70,vFFLits,0);
    local_b0 = pNew;
    Bmc_BmciUnfold(pNew,pGVar9,pVVar15,1);
    iVar2 = vFFLits->nSize;
    if (iVar2 != pVVar15->nSize) {
      __assert_fail("Vec_IntSize(vLits0) == Vec_IntSize(vLits1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                    ,0xd7,
                    "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                   );
    }
    local_c0->nSize = 0;
    iVar12 = 0;
    iVar11 = 0;
    if (0 < iVar2) {
      iVar11 = iVar2;
    }
    local_7c = 0;
    for (; iVar11 != iVar12; iVar12 = iVar12 + 1) {
      iVar3 = Vec_IntEntry(vFFLits,iVar12);
      iLit1 = Vec_IntEntry(pVVar15,iVar12);
      if (iVar3 == iLit1 || iLit1 < 2 && iVar3 < 2) {
        Vec_IntPush(local_c0,-1);
      }
      else {
        iVar3 = Gia_ManHashXor(local_b0,iVar3,iLit1);
        Vec_IntPush(local_c0,iVar3);
        local_7c = local_7c + 1;
      }
    }
    uVar14 = local_c0->nSize;
    if (uVar14 != local_70->nRegs) {
      __assert_fail("Vec_IntSize(vMiters) == Gia_ManRegNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                    ,0xdf,
                    "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                   );
    }
    uVar8 = 0;
    uVar13 = (ulong)uVar14;
    if ((int)uVar14 < 1) {
      uVar13 = uVar8;
    }
    iVar12 = 0;
    iVar11 = 1;
    for (; uVar13 != uVar8; uVar8 = uVar8 + 1) {
      iVar12 = iVar12 + local_c0->pArray[uVar8];
    }
    if (iVar12 + iVar2 == 0) {
      psVar16 = local_b8;
      if (fVerbose != 0) {
        printf("Reached a fixed point after %d frames.  \n",(ulong)((int)local_50 + 1));
        psVar16 = local_b8;
      }
      break;
    }
    local_68 = uVar13;
    pGVar9 = Bmc_BmciPart(local_b0,local_a8,local_c0,local_90,local_58);
    pAig = Gia_ManToAigSimple(pGVar9);
    pAig->nRegs = 0;
    p_01 = Cnf_Derive(pAig,pAig->nObjs[3]);
    Aig_ManStop(pAig);
    iVar11 = 0;
    while ((iVar11 < pGVar9->nObjs &&
           (pGVar10 = Gia_ManObj(pGVar9,iVar11), pGVar10 != (Gia_Obj_t *)0x0))) {
      piVar1 = p_01->pVarNums;
      iVar2 = Gia_ObjId(pGVar9,pGVar10);
      if (-1 < piVar1[iVar2]) {
        piVar1 = p_01->pVarNums;
        iVar2 = Gia_ObjId(pGVar9,pGVar10);
        piVar1[iVar2] = piVar1[iVar2] + (int)local_98;
      }
      iVar11 = iVar11 + 1;
    }
    psVar16 = local_b8;
    for (lVar5 = 0; lVar5 < p_01->nLiterals; lVar5 = lVar5 + 1) {
      (*p_01->pClauses)[lVar5] = (*p_01->pClauses)[lVar5] + (int)local_98 * 2;
    }
    uVar14 = (int)local_98 + p_01->nVars;
    local_98 = (ulong)uVar14;
    sat_solver_setnvars(local_b8,uVar14);
    lVar5 = 0;
    while (lVar5 < p_01->nClauses) {
      iVar11 = sat_solver_addclause(psVar16,p_01->pClauses[lVar5],p_01->pClauses[lVar5 + 1]);
      lVar5 = lVar5 + 1;
      if (iVar11 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                      ,0xee,
                      "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                     );
      }
    }
    iVar11 = 0;
    local_38 = p_01;
    while ((iVar11 < pGVar9->vCis->nSize - pGVar9->nRegs &&
           (pGVar10 = Gia_ManCi(pGVar9,iVar11), pGVar10 != (Gia_Obj_t *)0x0))) {
      piVar1 = p_01->pVarNums;
      iVar2 = Gia_ObjId(pGVar9,pGVar10);
      uVar14 = piVar1[iVar2];
      iVar2 = Gia_ObjId(pGVar9,pGVar10);
      iVar2 = Vec_IntEntry(local_90,iVar2);
      uVar4 = Vec_IntEntry(local_a8,iVar2);
      if (uVar4 != 0xffffffff) {
        local_5c = iVar11;
        if ((int)(uVar4 | uVar14) < 0) {
          __assert_fail("iVarA >= 0 && iVarB >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0x16a,"int sat_solver_add_buffer(sat_solver *, int, int, int)");
        }
        uVar14 = uVar14 * 2;
        local_74 = uVar4 * 2 + 1;
        local_78 = uVar14;
        iVar2 = sat_solver_addclause(local_b8,(lit *)&local_78,(lit *)&local_70);
        p_01 = local_38;
        iVar11 = local_5c;
        if (iVar2 != 0) {
          local_74 = uVar4 * 2;
          local_78 = uVar14 | 1;
          sat_solver_addclause(local_b8,(lit *)&local_78,(lit *)&local_70);
          p_01 = local_38;
          iVar11 = local_5c;
        }
      }
      iVar11 = iVar11 + 1;
    }
    pVVar15 = local_88;
    for (lVar5 = 0; lVar5 < pGVar9->nObjs; lVar5 = lVar5 + 1) {
      iVar11 = (int)lVar5;
      pGVar10 = Gia_ManObj(pGVar9,iVar11);
      if (pGVar10 == (Gia_Obj_t *)0x0) break;
      uVar14 = (uint)*(undefined8 *)pGVar10;
      if ((((uVar14 & 0x9fffffff) == 0x9fffffff) ||
          (-1 < (int)uVar14 && (~uVar14 & 0x1fffffff) != 0)) && (-1 < p_01->pVarNums[lVar5])) {
        if ((uVar14 & 0x9fffffff) != 0x9fffffff) {
          iVar2 = Vec_IntEntry(local_90,iVar11);
          iVar2 = Vec_IntEntry(local_a8,iVar2);
          if (iVar2 != -1) {
            __assert_fail("Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                          ,0xfc,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
        }
        iVar11 = Vec_IntEntry(local_90,iVar11);
        Vec_IntWriteEntry(local_a8,iVar11,p_01->pVarNums[lVar5]);
      }
    }
    Cnf_DataFree(p_01);
    Gia_ManStop(pGVar9);
    psVar16 = local_b8;
    uVar14 = 0;
    uVar13 = local_68;
    for (iVar11 = 0; (int)uVar13 != iVar11; iVar11 = iVar11 + 1) {
      iLit = Vec_IntEntry(local_c0,iVar11);
      if (iLit != -1) {
        iVar2 = Abc_Lit2Var(iLit);
        iVar12 = Vec_IntEntry(local_a8,iVar2);
        iVar2 = iLit;
        if (iVar12 < 1) {
          __assert_fail("Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                        ,0x107,
                        "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                       );
        }
        if (iLit < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x134,"int Abc_Lit2LitV(int *, int)");
        }
        piVar1 = local_a8->pArray;
        uVar4 = Abc_Lit2Var(iLit);
        iLit = Abc_Var2Lit(piVar1[uVar4],iVar2 & 1);
        iVar2 = sat_solver_solve(psVar16,&iLit,(lit *)&local_c0,0,0,0,0);
        if (iVar2 == -1) {
          iVar2 = Vec_IntEntry(vFFLits,iVar11);
          pVVar15 = local_88;
          iVar12 = Vec_IntEntry(local_88,iVar11);
          if ((iVar2 < 2 && iVar12 < 2) || (iVar2 == iVar12)) {
            __assert_fail("(iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                          ,0x118,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
          p_02 = pVVar15;
          if (iVar12 < 2) {
            p_02 = vFFLits;
            iVar2 = iVar12;
          }
          Vec_IntWriteEntry(p_02,iVar11,iVar2);
          iVar2 = Vec_IntEntry(vFFLits,iVar11);
          iVar12 = Vec_IntEntry(pVVar15,iVar11);
          uVar13 = local_68;
          if (iVar2 != iVar12) {
            __assert_fail("iLit0 == iLit1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                          ,0x11f,
                          "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                         );
          }
        }
        else {
          pVVar15 = local_88;
          if (iVar2 != 1) {
            if (iVar2 != 0) {
              __assert_fail("status == l_False",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmci.c"
                            ,0x115,
                            "int Bmc_BmciPerform(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int, int, int)"
                           );
            }
            pcVar7 = "Timeout reached after %d seconds.  \n";
            iVar11 = 0;
            uVar13 = (ulong)local_80;
            goto LAB_00480dd2;
          }
          uVar14 = uVar14 + 1;
          uVar13 = local_68;
        }
      }
    }
    iVar11 = (int)local_50;
    if (fVerbose != 0) {
      printf("Frame %4d : ",(ulong)(iVar11 + 1));
      printf("Vars =%7d  ",local_98);
      uVar4 = sat_solver_nclauses(psVar16);
      printf("Clause =%10d  ",(ulong)uVar4);
      uVar4 = sat_solver_nconflicts(psVar16);
      printf("Conflict =%10d  ",(ulong)uVar4);
      printf("AIG =%7d  ",
             (ulong)(uint)(~(local_b0->vCos->nSize + local_b0->vCis->nSize) + local_b0->nObjs));
      printf("Miters =%5d  ",(ulong)local_7c);
      iVar2 = 0x81d497;
      printf("SAT =%5d  ",(ulong)uVar14);
      aVar6 = Abc_Clock();
      lVar5 = aVar6 - local_40;
      Abc_Print(iVar2,"%s =","Time");
      Abc_Print(iVar2,"%9.2f sec\n",(double)lVar5 / 1000000.0);
    }
    uVar13 = (ulong)(iVar11 + 1);
    iVar11 = 1;
    if (uVar14 == 0) goto code_r0x00480db1;
  }
LAB_00480dd9:
  sat_solver_delete(psVar16);
  Gia_ManStopP(&pNew);
  Vec_IntFree(vFFLits);
  Vec_IntFree(pVVar15);
  Vec_IntFree(local_c0);
  Vec_IntFree(local_a8);
  Vec_IntFree(local_90);
  Vec_IntFree(local_58);
  return iVar11;
code_r0x00480db1:
  pcVar7 = "Reached a fixed point after %d frames.  \n";
LAB_00480dd2:
  printf(pcVar7,uVar13);
  goto LAB_00480dd9;
}

Assistant:

int Bmc_BmciPerform( Gia_Man_t * p, Vec_Int_t * vInit0, Vec_Int_t * vInit1, int nFrames, int nWords, int nTimeOut, int fVerbose )
{
    int nSatVars = 1;
    Vec_Int_t * vLits0, * vLits1, * vMiters, * vSatMap, * vPartMap, * vCopies;
    Gia_Man_t * pNew, * pPart;
    Gia_Obj_t * pObj;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    int iVar0, iVar1, iLit, iLit0, iLit1;
    int i, f, status, nChanges, nMiters, RetValue = 1;
    assert( Vec_IntSize(vInit0) == Gia_ManRegNum(p) );
    assert( Vec_IntSize(vInit1) == Gia_ManRegNum(p) );

    // start the SAT solver
    pSat = sat_solver_new();
    sat_solver_set_runtime_limit( pSat, nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );

    pNew = Gia_ManStart( 10000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;

    vLits0 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit0, iLit, i )
        Vec_IntPush( vLits0, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vLits1 = Vec_IntAlloc( Gia_ManRegNum(p) );
    Vec_IntForEachEntry( vInit1, iLit, i )
        Vec_IntPush( vLits1, iLit < 2 ? iLit : Gia_ManAppendCi(pNew) );

    vMiters  = Vec_IntAlloc( 1000 );
    vSatMap  = Vec_IntAlloc( 1000 );
    vPartMap = Vec_IntAlloc( 1000 );
    vCopies  = Vec_IntAlloc( 1000 );
    for ( f = 0; f < nFrames; f++ )
    {
        abctime clk = Abc_Clock();
        Bmc_BmciUnfold( pNew, p, vLits0, 0 );
        Bmc_BmciUnfold( pNew, p, vLits1, 1 );
        assert( Vec_IntSize(vLits0) == Vec_IntSize(vLits1) );
        nMiters  = 0;
        Vec_IntClear( vMiters );
        Vec_IntForEachEntryTwo( vLits0, vLits1, iLit0, iLit1, i )
            if ( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 )
                Vec_IntPush( vMiters, Gia_ManHashXor(pNew, iLit0, iLit1) ), nMiters++;
            else
                Vec_IntPush( vMiters, -1 );
        assert( Vec_IntSize(vMiters) == Gia_ManRegNum(p) );
        if ( Vec_IntSum(vMiters) + Vec_IntSize(vLits1) == 0 )
        {
            if ( fVerbose )
                printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
        // create new part
        pPart = Bmc_BmciPart( pNew, vSatMap, vMiters, vPartMap, vCopies );
        pCnf = Cnf_DeriveGiaRemapped( pPart );
        Cnf_DataLiftGia( pCnf, pPart, nSatVars );
        nSatVars += pCnf->nVars;
        sat_solver_setnvars( pSat, nSatVars );
        for ( i = 0; i < pCnf->nClauses; i++ )
            if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
                assert( 0 );
        // stitch the clauses
        Gia_ManForEachPi( pPart, pObj, i )
        {
            iVar0 = pCnf->pVarNums[Gia_ObjId(pPart, pObj)];
            iVar1 = Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, Gia_ObjId(pPart, pObj)) );
            if ( iVar1 == -1 )
                continue;
            sat_solver_add_buffer( pSat, iVar0, iVar1, 0 );
        }
        // transfer variables
        Gia_ManForEachCand( pPart, pObj, i )
            if ( pCnf->pVarNums[i] >= 0 )
            {
                assert( Gia_ObjIsCi(pObj) || Vec_IntEntry( vSatMap, Vec_IntEntry(vPartMap, i) ) == -1 );
                Vec_IntWriteEntry( vSatMap, Vec_IntEntry(vPartMap, i), pCnf->pVarNums[i] );
            }
        Cnf_DataFree( pCnf );
        Gia_ManStop( pPart );
        // perform runs
        nChanges = 0;
        Vec_IntForEachEntry( vMiters, iLit, i )
        {
            if ( iLit == -1 )
                continue;
            assert( Vec_IntEntry(vSatMap, Abc_Lit2Var(iLit)) > 0 );
            iLit = Abc_Lit2LitV( Vec_IntArray(vSatMap), iLit );
            status = sat_solver_solve( pSat, &iLit, &iLit + 1, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            if ( status == l_True )
            {
                nChanges++;
                continue;
            }
            if ( status == l_Undef )
            {
                printf( "Timeout reached after %d seconds.  \n", nTimeOut );
                RetValue = 0;
                goto cleanup;
            }
            assert( status == l_False );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( (iLit0 >= 2 || iLit1 >= 2) && iLit0 != iLit1 );
            if ( iLit1 >= 2 )
                Vec_IntWriteEntry( vLits1, i, iLit0 );
            else
                Vec_IntWriteEntry( vLits0, i, iLit1 );
            iLit0 = Vec_IntEntry( vLits0, i );
            iLit1 = Vec_IntEntry( vLits1, i );
            assert( iLit0 == iLit1 );
        }
        if ( fVerbose )
        {
            printf( "Frame %4d : ",     f+1 );
            printf( "Vars =%7d  ",      nSatVars );
            printf( "Clause =%10d  ",   sat_solver_nclauses(pSat) );
            printf( "Conflict =%10d  ", sat_solver_nconflicts(pSat) );
            printf( "AIG =%7d  ",       Gia_ManAndNum(pNew) );
            printf( "Miters =%5d  ",    nMiters );
            printf( "SAT =%5d  ",       nChanges );
            Abc_PrintTime( 1, "Time",   Abc_Clock() - clk );
        }
        if ( nChanges == 0 )
        {
            printf( "Reached a fixed point after %d frames.  \n", f+1 );
            break;
        }
    }
cleanup:

    sat_solver_delete( pSat );
    Gia_ManStopP( &pNew );
    Vec_IntFree( vLits0 );
    Vec_IntFree( vLits1 );
    Vec_IntFree( vMiters );
    Vec_IntFree( vSatMap );
    Vec_IntFree( vPartMap );
    Vec_IntFree( vCopies );
    return RetValue;
}